

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * ot::commissioner::CommissionerImpl::ValidateConfig
                  (Error *__return_storage_ptr__,Config *aConfig)

{
  string *this;
  pointer puVar1;
  pointer puVar2;
  char *pcVar3;
  bool bVar4;
  char *pcVar5;
  undefined1 *puVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar7;
  bool bVar8;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  writer write_1;
  Tlv commissionerIdTlv;
  writer write;
  undefined1 local_100 [8];
  undefined1 *local_f8;
  undefined1 local_f0 [8];
  undefined1 local_e8 [16];
  undefined1 local_d8 [40];
  string local_b0;
  writer local_90;
  undefined1 local_88 [8];
  size_t *psStack_80;
  char *local_78;
  size_t local_70;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_68;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_60;
  code *local_58;
  code *pcStack_50;
  code *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  local_38 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_38;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  tlv::Tlv::Tlv((Tlv *)&local_b0,kCommissionerId,&aConfig->mId,kMeshCoP);
  if ((aConfig->mId)._M_string_length == 0) {
    local_88 = (undefined1  [8])((ulong)local_88 & 0xffffffff00000000);
    psStack_80 = (size_t *)0x2188ac;
    local_78 = (char *)0x1c;
    local_70 = 0;
    local_60 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)0x0;
    pcVar7 = "commissioner ID is mandatory";
    local_68 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)local_88;
    do {
      pcVar5 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",(format_string_checker<char> *)local_88);
      }
      pcVar7 = pcVar5;
    } while (pcVar5 != "");
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_88;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_d8,(v10 *)"commissioner ID is mandatory",(string_view)ZEXT816(0x1c),
               args_00);
    local_100._0_4_ = kInvalidArgs;
    local_f8 = local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_d8._0_8_,(pointer)(local_d8._0_8_ + local_d8._8_8_));
LAB_0015812f:
    __return_storage_ptr__->mCode = local_100._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_f8);
    if (local_f8 != local_e8) {
      operator_delete(local_f8);
    }
    if ((format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
         *)local_d8._0_8_ !=
        (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
         *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_);
    }
    bVar8 = false;
  }
  else {
    bVar4 = tlv::Tlv::IsValid((Tlv *)&local_b0);
    bVar8 = true;
    if (!bVar4) {
      local_88._0_4_ = string_type;
      pcVar7 = "{} is not a valid Commissioner ID";
      psStack_80 = (size_t *)0x2188c9;
      local_78 = (char *)0x21;
      local_70 = 0x100000000;
      local_60 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)::fmt::v10::detail::
                    parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      local_90.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_88;
      local_68 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)local_88;
      do {
        if (pcVar7 == "") break;
        pcVar5 = pcVar7;
        if (*pcVar7 == '{') {
LAB_00157fd4:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&local_90,pcVar7,pcVar5);
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar5,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_88);
          bVar8 = true;
        }
        else {
          pcVar5 = pcVar7 + 1;
          bVar8 = pcVar5 != "";
          if (bVar8) {
            if (*pcVar5 != '{') {
              pcVar3 = pcVar7 + 2;
              do {
                pcVar5 = pcVar3;
                bVar8 = pcVar5 != "";
                if (pcVar5 == "") goto LAB_00157fd0;
                pcVar3 = pcVar5 + 1;
              } while (*pcVar5 != '{');
            }
            bVar8 = true;
          }
LAB_00157fd0:
          if (bVar8) goto LAB_00157fd4;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&local_90,pcVar7,"");
          bVar8 = false;
        }
      } while (bVar8);
      local_88 = (undefined1  [8])(aConfig->mId)._M_dataplus._M_p;
      psStack_80 = (size_t *)(aConfig->mId)._M_string_length;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_88;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x21;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_d8,(v10 *)"{} is not a valid Commissioner ID",fmt,args);
      local_100._0_4_ = kInvalidArgs;
      local_f8 = local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_d8._0_8_,(pointer)(local_d8._0_8_ + local_d8._8_8_));
      goto LAB_0015812f;
    }
  }
  if ((pointer)local_b0._M_string_length != (pointer)0x0) {
    operator_delete((void *)local_b0._M_string_length);
  }
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  if (aConfig->mKeepAliveInterval - 0x1e < 0x10) {
    if (aConfig->mEnableCcm == true) {
      tlv::Tlv::Tlv((Tlv *)&local_b0,kDomainName,&aConfig->mDomainName,kMeshCoP);
      if ((aConfig->mDomainName)._M_string_length == 0) {
        local_88 = (undefined1  [8])((ulong)local_88 & 0xffffffff00000000);
        pcVar7 = "missing Domain Name for CCM network";
        psStack_80 = (size_t *)0x218919;
        local_78 = (char *)0x23;
        local_70 = 0;
        local_60 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)0x0;
        local_90.handler_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_88;
        local_68 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)local_88;
        do {
          if (pcVar7 == "") break;
          pcVar5 = pcVar7;
          if (*pcVar7 == '{') {
LAB_001586a2:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)&local_90,pcVar7,pcVar5);
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar5,"",(format_string_checker<char> *)local_88);
            bVar8 = true;
          }
          else {
            pcVar5 = pcVar7 + 1;
            bVar8 = pcVar5 != "";
            if (bVar8) {
              if (*pcVar5 != '{') {
                pcVar3 = pcVar7 + 2;
                do {
                  pcVar5 = pcVar3;
                  bVar8 = pcVar5 != "";
                  if (pcVar5 == "") goto LAB_0015869e;
                  pcVar3 = pcVar5 + 1;
                } while (*pcVar5 != '{');
              }
              bVar8 = true;
            }
LAB_0015869e:
            if (bVar8) goto LAB_001586a2;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)&local_90,pcVar7,"");
            bVar8 = false;
          }
        } while (bVar8);
        args_05.field_1.values_ = in_R9.values_;
        args_05.desc_ = (unsigned_long_long)local_88;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_d8,(v10 *)"missing Domain Name for CCM network",
                   (string_view)ZEXT816(0x23),args_05);
        local_100._0_4_ = kInvalidArgs;
        local_f8 = local_e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_d8._0_8_,(pointer)(local_d8._0_8_ + local_d8._8_8_));
        __return_storage_ptr__->mCode = local_100._0_4_;
LAB_00158878:
        std::__cxx11::string::operator=((string *)this,(string *)&local_f8);
        if (local_f8 != local_e8) {
          operator_delete(local_f8);
        }
        puVar6 = local_d8 + 0x10;
LAB_0015896c:
        if (*(undefined1 **)(puVar6 + -0x10) != puVar6) {
          operator_delete(*(undefined1 **)(puVar6 + -0x10));
        }
      }
      else {
        bVar8 = tlv::Tlv::IsValid((Tlv *)&local_b0);
        if (!bVar8) {
          local_88._0_4_ = ulong_long_type;
          pcVar7 = "Domain Name is too long (length={})";
          psStack_80 = (size_t *)0x21893d;
          local_78 = (char *)0x23;
          local_70 = 0x100000000;
          local_60 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                      *)::fmt::v10::detail::
                        parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_90.handler_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_88;
          local_68 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                      *)local_88;
          do {
            if (pcVar7 == "") break;
            pcVar5 = pcVar7;
            if (*pcVar7 == '{') {
LAB_001587d8:
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long>_>
              ::writer::operator()((writer *)&local_90,pcVar7,pcVar5);
              pcVar7 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long>&>
                                 (pcVar5,"",(format_string_checker<char> *)local_88);
              bVar8 = true;
            }
            else {
              pcVar5 = pcVar7 + 1;
              bVar8 = pcVar5 != "";
              if (bVar8) {
                if (*pcVar5 != '{') {
                  pcVar3 = pcVar7 + 2;
                  do {
                    pcVar5 = pcVar3;
                    bVar8 = pcVar5 != "";
                    if (pcVar5 == "") goto LAB_001587d4;
                    pcVar3 = pcVar5 + 1;
                  } while (*pcVar5 != '{');
                }
                bVar8 = true;
              }
LAB_001587d4:
              if (bVar8) goto LAB_001587d8;
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long>_>
              ::writer::operator()((writer *)&local_90,pcVar7,"");
              bVar8 = false;
            }
          } while (bVar8);
          local_88 = (undefined1  [8])(aConfig->mDomainName)._M_string_length;
          args_06.field_1.values_ = in_R9.values_;
          args_06.desc_ = (unsigned_long_long)local_88;
          fmt_02.size_ = 4;
          fmt_02.data_ = (char *)0x23;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_d8,(v10 *)"Domain Name is too long (length={})",fmt_02,args_06)
          ;
          local_100._0_4_ = kInvalidArgs;
          local_f8 = local_e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_d8._0_8_,(pointer)(local_d8._0_8_ + local_d8._8_8_));
          __return_storage_ptr__->mCode = local_100._0_4_;
          goto LAB_00158878;
        }
        if ((aConfig->mPrivateKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (aConfig->mPrivateKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_07.field_1.values_ = in_R9.values_;
          args_07.desc_ = (unsigned_long_long)local_d8;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_100,(v10 *)"missing Private Key file for CCM network",
                     (string_view)ZEXT816(0x28),args_07);
          local_88._0_4_ = 2;
          psStack_80 = &local_70;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&psStack_80,CONCAT44(local_100._4_4_,local_100._0_4_),
                     local_f8 + CONCAT44(local_100._4_4_,local_100._0_4_));
LAB_0015893f:
          __return_storage_ptr__->mCode = local_88._0_4_;
          std::__cxx11::string::operator=((string *)this,(string *)&psStack_80);
          if (psStack_80 != &local_70) {
            operator_delete(psStack_80);
          }
          puVar6 = local_f0;
          goto LAB_0015896c;
        }
        if ((aConfig->mCertificate).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (aConfig->mCertificate).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_08.field_1.values_ = in_R9.values_;
          args_08.desc_ = (unsigned_long_long)local_d8;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_100,(v10 *)"missing Certificate file for CCM network",
                     (string_view)ZEXT816(0x28),args_08);
          local_88._0_4_ = 2;
          psStack_80 = &local_70;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&psStack_80,CONCAT44(local_100._4_4_,local_100._0_4_),
                     local_f8 + CONCAT44(local_100._4_4_,local_100._0_4_));
          goto LAB_0015893f;
        }
        if ((aConfig->mTrustAnchor).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (aConfig->mTrustAnchor).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)local_d8;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_100,(v10 *)"missing Trust Anchor file for CCM network",
                     (string_view)ZEXT816(0x29),args_01);
          local_88._0_4_ = 2;
          psStack_80 = &local_70;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&psStack_80,CONCAT44(local_100._4_4_,local_100._0_4_),
                     local_f8 + CONCAT44(local_100._4_4_,local_100._0_4_));
          goto LAB_0015893f;
        }
      }
      if ((pointer)local_b0._M_string_length == (pointer)0x0) {
        return __return_storage_ptr__;
      }
      goto LAB_00158602;
    }
    puVar1 = (aConfig->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (aConfig->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar1 == puVar2) {
      local_88 = (undefined1  [8])((ulong)(uint)local_88._4_4_ << 0x20);
      pcVar7 = "missing PSKc for non-CCM network";
      psStack_80 = (size_t *)0x2189dd;
      local_78 = (char *)0x20;
      local_70 = 0;
      local_60 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)0x0;
      local_d8._0_8_ =
           (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)local_88;
      local_68 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)local_88;
      do {
        if (pcVar7 == "") break;
        pcVar5 = pcVar7;
        if (*pcVar7 == '{') {
LAB_0015854c:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_d8,pcVar7,pcVar5);
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar5,"",(format_string_checker<char> *)local_88);
          bVar8 = true;
        }
        else {
          pcVar5 = pcVar7 + 1;
          bVar8 = pcVar5 != "";
          if (bVar8) {
            if (*pcVar5 != '{') {
              pcVar3 = pcVar7 + 2;
              do {
                pcVar5 = pcVar3;
                bVar8 = pcVar5 != "";
                if (pcVar5 == "") goto LAB_00158548;
                pcVar3 = pcVar5 + 1;
              } while (*pcVar5 != '{');
            }
            bVar8 = true;
          }
LAB_00158548:
          if (bVar8) goto LAB_0015854c;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_d8,pcVar7,"");
          bVar8 = false;
        }
      } while (bVar8);
      args_04.field_1.args_ = in_R9.args_;
      args_04.desc_ = (unsigned_long_long)local_88;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b0,(v10 *)"missing PSKc for non-CCM network",(string_view)ZEXT816(0x20),
                 args_04);
      local_100._0_4_ = kInvalidArgs;
      local_f8 = local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_b0._M_dataplus._M_p,
                 local_b0._M_string_length + local_b0._M_dataplus._M_p);
    }
    else {
      if ((ulong)((long)puVar2 - (long)puVar1) < 0x11) {
        return __return_storage_ptr__;
      }
      local_88._0_4_ = ulong_long_type;
      psStack_80 = (size_t *)0x2189fe;
      local_78 = (char *)0x1c;
      local_70 = 0x100000000;
      local_60 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)::fmt::v10::detail::
                    parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      pcVar7 = "PSKc is too long (length={})";
      local_68 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)local_88;
      do {
        pcVar5 = pcVar7 + 1;
        if (*pcVar7 == '}') {
          if ((pcVar5 == "") || (*pcVar5 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar5 = pcVar7 + 2;
        }
        else if (*pcVar7 == '{') {
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long>&>
                             (pcVar7,"",(format_string_checker<char> *)local_88);
        }
        pcVar7 = pcVar5;
      } while (pcVar5 != "");
      local_88 = (undefined1  [8])
                 ((aConfig->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish +
                 -(long)(aConfig->mPSKc).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      args_03.field_1.values_ = in_R9.values_;
      args_03.desc_ = (unsigned_long_long)local_88;
      fmt_01.size_ = 4;
      fmt_01.data_ = (char *)0x1c;
      ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)"PSKc is too long (length={})",fmt_01,args_03)
      ;
      local_100._0_4_ = kInvalidArgs;
      local_f8 = local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_b0._M_dataplus._M_p,
                 local_b0._M_string_length + local_b0._M_dataplus._M_p);
    }
    __return_storage_ptr__->mCode = local_100._0_4_;
  }
  else {
    local_88._0_4_ = uint_type;
    local_88._4_4_ = uint_type;
    psStack_80 = (size_t *)CONCAT44(psStack_80._4_4_,2);
    pcVar7 = "keep-alive internal {} exceeds range [{}, {}]";
    local_78 = "keep-alive internal {} exceeds range [{}, {}]";
    local_70 = 0x2d;
    local_68 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)0x300000000;
    local_58 = ::fmt::v10::detail::
               parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
    pcStack_50 = ::fmt::v10::detail::
                 parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
    local_48 = ::fmt::v10::detail::
               parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
    local_d8._0_8_ =
         (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)local_88;
    local_60 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)local_88;
    do {
      if (pcVar7 == "") break;
      pcVar5 = pcVar7;
      if (*pcVar7 == '{') {
LAB_00158315:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int,_unsigned_int,_unsigned_int>_>
        ::writer::operator()((writer *)local_d8,pcVar7,pcVar5);
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int,unsigned_int,unsigned_int>&>
                           (pcVar5,"",
                            (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                             *)local_88);
        bVar8 = true;
      }
      else {
        pcVar5 = pcVar7 + 1;
        bVar8 = pcVar5 != "";
        if (bVar8) {
          if (*pcVar5 != '{') {
            pcVar3 = pcVar7 + 2;
            do {
              pcVar5 = pcVar3;
              bVar8 = pcVar5 != "";
              if (pcVar5 == "") goto LAB_00158311;
              pcVar3 = pcVar5 + 1;
            } while (*pcVar5 != '{');
          }
          bVar8 = true;
        }
LAB_00158311:
        if (bVar8) goto LAB_00158315;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int,_unsigned_int,_unsigned_int>_>
        ::writer::operator()((writer *)local_d8,pcVar7,"");
        bVar8 = false;
      }
    } while (bVar8);
    local_88 = (undefined1  [8])(ulong)aConfig->mKeepAliveInterval;
    local_78 = (char *)0x1e;
    local_68 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)0x2d;
    args_02.field_1.values_ = in_R9.values_;
    args_02.desc_ = (unsigned_long_long)local_88;
    fmt_00.size_ = 0x222;
    fmt_00.data_ = (char *)0x2d;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"keep-alive internal {} exceeds range [{}, {}]",fmt_00,args_02);
    local_100._0_4_ = kInvalidArgs;
    local_f8 = local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_b0._M_dataplus._M_p,
               local_b0._M_string_length + local_b0._M_dataplus._M_p);
    __return_storage_ptr__->mCode = local_100._0_4_;
  }
  std::__cxx11::string::operator=((string *)this,(string *)&local_f8);
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  local_b0._M_string_length = (size_type)local_b0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
    return __return_storage_ptr__;
  }
LAB_00158602:
  operator_delete((void *)local_b0._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::ValidateConfig(const Config &aConfig)
{
    Error error;

    {
        tlv::Tlv commissionerIdTlv{tlv::Type::kCommissionerId, aConfig.mId};
        VerifyOrExit(!aConfig.mId.empty(), error = ERROR_INVALID_ARGS("commissioner ID is mandatory"));
        VerifyOrExit(commissionerIdTlv.IsValid(),
                     error = ERROR_INVALID_ARGS("{} is not a valid Commissioner ID", aConfig.mId));
    }

    VerifyOrExit(
        (aConfig.mKeepAliveInterval >= kMinKeepAliveInterval && aConfig.mKeepAliveInterval <= kMaxKeepAliveInterval),
        error = ERROR_INVALID_ARGS("keep-alive internal {} exceeds range [{}, {}]", aConfig.mKeepAliveInterval,
                                   kMinKeepAliveInterval, kMaxKeepAliveInterval));

    if (aConfig.mEnableCcm)
    {
        tlv::Tlv domainNameTlv{tlv::Type::kDomainName, aConfig.mDomainName};

#if !OT_COMM_CONFIG_CCM_ENABLE
        ExitNow(error = ERROR_INVALID_ARGS(CCM_NOT_IMPLEMENTED));
#endif

        VerifyOrExit(!aConfig.mDomainName.empty(), error = ERROR_INVALID_ARGS("missing Domain Name for CCM network"));
        VerifyOrExit(domainNameTlv.IsValid(),
                     error = ERROR_INVALID_ARGS("Domain Name is too long (length={})", aConfig.mDomainName.size()));
        VerifyOrExit(!aConfig.mPrivateKey.empty(),
                     error = ERROR_INVALID_ARGS("missing Private Key file for CCM network"));
        VerifyOrExit(!aConfig.mCertificate.empty(),
                     error = ERROR_INVALID_ARGS("missing Certificate file for CCM network"));
        VerifyOrExit(!aConfig.mTrustAnchor.empty(),
                     error = ERROR_INVALID_ARGS("missing Trust Anchor file for CCM network"));
    }
    else
    {
        // Should we also enable setting PSKc from passphrase?
        VerifyOrExit(!aConfig.mPSKc.empty(), error = ERROR_INVALID_ARGS("missing PSKc for non-CCM network"));
        VerifyOrExit(aConfig.mPSKc.size() <= kMaxPSKcLength,
                     error = ERROR_INVALID_ARGS("PSKc is too long (length={})", aConfig.mPSKc.size()));
    }

exit:
    return error;
}